

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ResolvingDecoder.cc
# Opt level: O0

int avro::parsing::ResolvingGrammarGenerator::bestBranch(NodePtr *writer,NodePtr *reader)

{
  bool bVar1;
  int iVar2;
  Type TVar3;
  Type TVar4;
  uint uVar5;
  type pNVar6;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  shared_ptr<avro::Node> *in_RSI;
  shared_ptr<avro::Node> *in_RDI;
  Type rt;
  NodePtr *r_1;
  size_t j_1;
  NodePtr r;
  size_t j;
  size_t c;
  Type t;
  shared_ptr<avro::Node> *in_stack_ffffffffffffff48;
  undefined4 in_stack_ffffffffffffff50;
  undefined4 in_stack_ffffffffffffff54;
  Name *in_stack_ffffffffffffff58;
  Name *in_stack_ffffffffffffff60;
  ulong local_70;
  NodePtr *in_stack_ffffffffffffffb8;
  shared_ptr<avro::Node> local_40;
  ulong local_30;
  ulong local_28;
  Type local_1c;
  shared_ptr<avro::Node> *local_18;
  shared_ptr<avro::Node> *local_10;
  int local_4;
  
  local_18 = in_RSI;
  local_10 = in_RDI;
  pNVar6 = boost::shared_ptr<avro::Node>::operator->(in_RDI);
  local_1c = Node::type(pNVar6);
  pNVar6 = boost::shared_ptr<avro::Node>::operator->(local_18);
  iVar2 = (*pNVar6->_vptr_Node[4])();
  local_28 = CONCAT44(extraout_var,iVar2);
  local_30 = 0;
  do {
    if (local_28 <= local_30) {
      local_70 = 0;
      do {
        if (local_28 <= local_70) {
          return -1;
        }
        pNVar6 = boost::shared_ptr<avro::Node>::operator->(local_18);
        iVar2 = (*pNVar6->_vptr_Node[5])(pNVar6,local_70 & 0xffffffff);
        pNVar6 = boost::shared_ptr<avro::Node>::operator->
                           ((shared_ptr<avro::Node> *)CONCAT44(extraout_var_02,iVar2));
        TVar3 = Node::type(pNVar6);
        iVar2 = (int)local_70;
        if (local_1c == AVRO_INT) {
          if (TVar3 == AVRO_LONG) {
            return iVar2;
          }
          if (TVar3 == AVRO_DOUBLE) {
            return iVar2;
          }
          if (TVar3 == AVRO_FLOAT) {
            return iVar2;
          }
        }
        else if (((uint)(local_1c + ~AVRO_INT) < 2) && (TVar3 == AVRO_DOUBLE)) {
          return iVar2;
        }
        local_70 = local_70 + 1;
      } while( true );
    }
    pNVar6 = boost::shared_ptr<avro::Node>::operator->(local_18);
    (*pNVar6->_vptr_Node[5])(pNVar6,local_30 & 0xffffffff);
    boost::shared_ptr<avro::Node>::shared_ptr
              ((shared_ptr<avro::Node> *)
               CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
               in_stack_ffffffffffffff48);
    pNVar6 = boost::shared_ptr<avro::Node>::operator->(&local_40);
    TVar3 = Node::type(pNVar6);
    if (TVar3 == AVRO_NUM_TYPES) {
      resolveSymbol(in_stack_ffffffffffffffb8);
      boost::shared_ptr<avro::Node>::operator=
                ((shared_ptr<avro::Node> *)in_stack_ffffffffffffff60,
                 (shared_ptr<avro::Node> *)in_stack_ffffffffffffff58);
      boost::shared_ptr<avro::Node>::~shared_ptr((shared_ptr<avro::Node> *)0x1dbc50);
    }
    TVar3 = local_1c;
    pNVar6 = boost::shared_ptr<avro::Node>::operator->(&local_40);
    TVar4 = Node::type(pNVar6);
    if (TVar3 == TVar4) {
      pNVar6 = boost::shared_ptr<avro::Node>::operator->(&local_40);
      uVar5 = (*pNVar6->_vptr_Node[2])();
      if ((uVar5 & 1) == 0) {
        local_4 = (int)local_30;
        bVar1 = true;
      }
      else {
        pNVar6 = boost::shared_ptr<avro::Node>::operator->(&local_40);
        iVar2 = (*pNVar6->_vptr_Node[3])();
        in_stack_ffffffffffffff60 = (Name *)CONCAT44(extraout_var_00,iVar2);
        pNVar6 = boost::shared_ptr<avro::Node>::operator->(local_10);
        iVar2 = (*pNVar6->_vptr_Node[3])();
        in_stack_ffffffffffffff58 = (Name *)CONCAT44(extraout_var_01,iVar2);
        bVar1 = Name::operator==(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
        in_stack_ffffffffffffff54 = CONCAT13(bVar1,(int3)in_stack_ffffffffffffff54);
        if (!bVar1) goto LAB_001dbd5a;
        local_4 = (int)local_30;
        bVar1 = true;
      }
    }
    else {
LAB_001dbd5a:
      bVar1 = false;
    }
    boost::shared_ptr<avro::Node>::~shared_ptr((shared_ptr<avro::Node> *)0x1dbd6c);
    if (bVar1) {
      return local_4;
    }
    local_30 = local_30 + 1;
  } while( true );
}

Assistant:

int ResolvingGrammarGenerator::bestBranch(const NodePtr& writer,
    const NodePtr& reader)
{
    Type t = writer->type();

    const size_t c = reader->leaves();
    for (size_t j = 0; j < c; ++j) {
        NodePtr r = reader->leafAt(j);
        if (r->type() == AVRO_SYMBOLIC) {
            r = resolveSymbol(r);
        }
        if (t == r->type()) {
            if (r->hasName()) {
                if (r->name() == writer->name()) {
                    return j;
                }
            } else {
                return j;
            }
        }
    }

    for (size_t j = 0; j < c; ++j) {
        const NodePtr& r = reader->leafAt(j);
        Type rt = r->type();
        switch (t) {
        case AVRO_INT:
            if (rt == AVRO_LONG || rt == AVRO_DOUBLE || rt == AVRO_FLOAT) {
                return j;
            }
            break;
        case AVRO_LONG:
        case AVRO_FLOAT:
            if (rt == AVRO_DOUBLE) {
                return j;
            }
            break;
        default:
            break;
        }
    }
    return -1;
}